

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShape.cpp
# Opt level: O2

void __thiscall chrono::ChVisualShape::ArchiveIN(ChVisualShape *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChVisualShape>(marchive);
  local_28._value = &this->visible;
  local_28._name = "visible";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChVisualShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVisualShape>();
    // stream in all member data:
    marchive >> CHNVP(visible);
}